

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml2.cpp
# Opt level: O3

void __thiscall
tinyxml2::XMLDocument::SetError(XMLDocument *this,XMLError error,int lineNum,char *format,...)

{
  ulong uVar1;
  char in_AL;
  char *pcVar2;
  size_t sVar3;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined4 in_XMM0_Da;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list va;
  undefined8 local_108;
  undefined1 *local_100;
  undefined1 *local_f8;
  undefined1 local_e8 [32];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined4 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  
  uVar1 = (ulong)error;
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Da;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  this->_errorID = error;
  this->_errorLineNum = lineNum;
  local_c8 = in_R8;
  local_c0 = in_R9;
  if ((((this->_errorStr)._flags & 0x200) != 0) &&
     (pcVar2 = (this->_errorStr)._start, pcVar2 != (char *)0x0)) {
    operator_delete__(pcVar2);
  }
  (this->_errorStr)._flags = 0;
  (this->_errorStr)._start = (char *)0x0;
  (this->_errorStr)._end = (char *)0x0;
  pcVar2 = (char *)operator_new__(1000);
  snprintf(pcVar2,1000,"Error=%s ErrorID=%d (0x%x) Line number=%d",
           *(undefined8 *)(_errorNames + uVar1 * 8),uVar1,uVar1,lineNum);
  if (format != (char *)0x0) {
    sVar3 = strlen(pcVar2);
    snprintf(pcVar2 + sVar3,1000 - sVar3,": ");
    sVar3 = strlen(pcVar2);
    local_f8 = local_e8;
    local_100 = &stack0x00000008;
    local_108 = 0x3000000020;
    vsnprintf(pcVar2 + sVar3,1000 - sVar3,format,&local_108);
  }
  StrPair::SetStr(&this->_errorStr,pcVar2,0);
  operator_delete__(pcVar2);
  return;
}

Assistant:

void XMLDocument::SetError( XMLError error, int lineNum, const char* format, ... )
{
    TIXMLASSERT( error >= 0 && error < XML_ERROR_COUNT );
    _errorID = error;
    _errorLineNum = lineNum;
	_errorStr.Reset();

    const size_t BUFFER_SIZE = 1000;
    char* buffer = new char[BUFFER_SIZE];

    TIXMLASSERT(sizeof(error) <= sizeof(int));
    TIXML_SNPRINTF(buffer, BUFFER_SIZE, "Error=%s ErrorID=%d (0x%x) Line number=%d", ErrorIDToName(error), int(error), int(error), lineNum);

	if (format) {
		size_t len = strlen(buffer);
		TIXML_SNPRINTF(buffer + len, BUFFER_SIZE - len, ": ");
		len = strlen(buffer);

		va_list va;
		va_start(va, format);
		TIXML_VSNPRINTF(buffer + len, BUFFER_SIZE - len, format, va);
		va_end(va);
	}
	_errorStr.SetStr(buffer);
	delete[] buffer;
}